

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

int __thiscall
rr::MultiSampleLineRasterizer::init(MultiSampleLineRasterizer *this,EVP_PKEY_CTX *ctx)

{
  Vector<float,_4> *a;
  int iVar1;
  float *pfVar2;
  Vector<float,_4> *in_RDX;
  float in_XMM0_Da;
  float fVar3;
  float y_;
  Vector<float,_4> local_124;
  tcu local_114 [8];
  Vec4 p3;
  tcu local_f4 [8];
  Vec4 p2;
  tcu local_d4 [8];
  Vec4 p1;
  tcu local_b4 [8];
  Vec4 p0;
  float offset;
  Vec4 normal4;
  Vector<float,_2> local_88;
  Vec2 normal2;
  Vector<float,_2> local_60;
  Vector<float,_4> local_58;
  VecAccess<float,_4,_2> local_48;
  Vector<float,_2> local_34;
  Vector<float,_2> local_2c;
  Vec2 lineVec;
  float lineWidth_local;
  Vec4 *v1_local;
  Vec4 *v0_local;
  MultiSampleLineRasterizer *this_local;
  
  lineVec.m_data[0] = in_XMM0_Da;
  unique0x100004dc = in_RDX;
  tcu::Vector<float,_4>::Vector(&local_58,in_RDX);
  local_48 = tcu::Vector<float,_4>::xy(&local_58);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_34);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&normal2,(Vector<float,_4> *)ctx);
  tcu::Vector<float,_4>::xy((Vector<float,_4> *)&normal2);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_60);
  tcu::operator-((tcu *)&local_2c,&local_34,&local_60);
  pfVar2 = tcu::Vector<float,_2>::operator[](&local_2c,1);
  fVar3 = *pfVar2;
  pfVar2 = tcu::Vector<float,_2>::operator[](&local_2c,0);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(normal4.m_data + 2),-fVar3,*pfVar2);
  tcu::normalize<float,2>((tcu *)&local_88,(Vector<float,_2> *)(normal4.m_data + 2));
  fVar3 = tcu::Vector<float,_2>::x(&local_88);
  y_ = tcu::Vector<float,_2>::y(&local_88);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(p0.m_data + 3),fVar3,y_,0.0,0.0);
  p0.m_data[2] = lineVec.m_data[0] / 2.0;
  tcu::operator*((tcu *)(p1.m_data + 2),(Vector<float,_4> *)(p0.m_data + 3),p0.m_data[2]);
  tcu::operator+(local_b4,(Vector<float,_4> *)ctx,(Vector<float,_4> *)(p1.m_data + 2));
  tcu::operator*((tcu *)(p2.m_data + 2),(Vector<float,_4> *)(p0.m_data + 3),p0.m_data[2]);
  tcu::operator-(local_d4,(Vector<float,_4> *)ctx,(Vector<float,_4> *)(p2.m_data + 2));
  a = stack0xffffffffffffffe0;
  tcu::operator*((tcu *)(p3.m_data + 2),(Vector<float,_4> *)(p0.m_data + 3),p0.m_data[2]);
  tcu::operator-(local_f4,a,(Vector<float,_4> *)(p3.m_data + 2));
  tcu::operator*((tcu *)&local_124,(Vector<float,_4> *)(p0.m_data + 3),p0.m_data[2]);
  tcu::operator+(local_114,stack0xffffffffffffffe0,&local_124);
  TriangleRasterizer::init(&this->m_triangleRasterizer0,(EVP_PKEY_CTX *)local_b4);
  iVar1 = TriangleRasterizer::init(&this->m_triangleRasterizer1,(EVP_PKEY_CTX *)local_f4);
  return iVar1;
}

Assistant:

void MultiSampleLineRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, float lineWidth)
{
	// allow creation of single sampled rasterizer objects but do not allow using them
	DE_ASSERT(m_numSamples > 1);

	const tcu::Vec2 lineVec		= tcu::Vec2(tcu::Vec4(v1).xy()) - tcu::Vec2(tcu::Vec4(v0).xy());
	const tcu::Vec2 normal2		= tcu::normalize(tcu::Vec2(-lineVec[1], lineVec[0]));
	const tcu::Vec4 normal4		= tcu::Vec4(normal2.x(), normal2.y(), 0, 0);
	const float offset			= lineWidth / 2.0f;

	const tcu::Vec4 p0 = v0 + normal4 * offset;
	const tcu::Vec4 p1 = v0 - normal4 * offset;
	const tcu::Vec4 p2 = v1 - normal4 * offset;
	const tcu::Vec4 p3 = v1 + normal4 * offset;

	// Edge 0 -> 1 is always along the line and edge 1 -> 2 is in 90 degree angle to the line
	m_triangleRasterizer0.init(p0, p3, p2);
	m_triangleRasterizer1.init(p2, p1, p0);
}